

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

float ImGui::ScaleRatioFromValueT<double,double,double>
                (ImGuiDataType data_type,double v,double v_min,double v_max,bool is_logarithmic,
                float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  undefined1 in_register_00001208 [56];
  undefined1 auVar5 [64];
  float fVar6;
  undefined1 auVar8 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 in_register_00001288 [56];
  undefined1 auVar11 [64];
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar7 [16];
  
  auVar11._8_56_ = in_register_00001288;
  auVar11._0_8_ = v_max;
  auVar9._8_56_ = in_register_00001248;
  auVar9._0_8_ = v_min;
  auVar5._8_56_ = in_register_00001208;
  auVar5._0_8_ = v;
  auVar7 = auVar9._0_16_;
  fVar6 = 0.0;
  if ((v_min != v_max) || (NAN(v_min) || NAN(v_max))) {
    auVar10 = auVar11._0_16_;
    auVar2 = vminsd_avx(auVar7,auVar10);
    auVar1 = vmaxsd_avx(auVar10,auVar7);
    auVar8 = vminsd_avx(auVar1,auVar5._0_16_);
    auVar1 = vcmpsd_avx(auVar5._0_16_,auVar2,1);
    auVar1 = vblendvpd_avx(auVar8,auVar2,auVar1);
    dVar3 = auVar1._0_8_;
    if (is_logarithmic) {
      auVar2 = vminsd_avx(auVar10,auVar7);
      auVar1 = vmaxsd_avx(auVar7,auVar10);
      dVar4 = auVar1._0_8_;
      auVar8._8_8_ = 0x7fffffffffffffff;
      auVar8._0_8_ = 0x7fffffffffffffff;
      auVar7 = vandpd_avx(auVar2,auVar8);
      dVar14 = (double)logarithmic_zero_epsilon;
      dVar12 = auVar2._0_8_;
      dVar13 = dVar12;
      if (auVar7._0_8_ < dVar14) {
        fVar6 = logarithmic_zero_epsilon;
        if (dVar12 < 0.0) {
          fVar6 = -logarithmic_zero_epsilon;
        }
        dVar13 = (double)fVar6;
      }
      auVar7 = vandpd_avx(auVar1,auVar8);
      dVar15 = dVar4;
      if (auVar7._0_8_ < dVar14) {
        fVar6 = logarithmic_zero_epsilon;
        if (dVar4 < 0.0) {
          fVar6 = -logarithmic_zero_epsilon;
        }
        dVar15 = (double)fVar6;
      }
      if ((dVar12 != 0.0) || (0.0 <= dVar4)) {
        if ((dVar4 == 0.0) && (dVar12 < 0.0)) {
          dVar15 = (double)-logarithmic_zero_epsilon;
        }
      }
      else {
        dVar13 = (double)-logarithmic_zero_epsilon;
      }
      fVar6 = 0.0;
      if (dVar13 < dVar3) {
        if (dVar15 <= dVar3) {
          fVar6 = 1.0;
        }
        else if (0.0 <= v_min * v_max) {
          if ((dVar12 < 0.0) || (dVar4 < 0.0)) {
            dVar3 = log(dVar3 / dVar15);
            dVar4 = log(dVar13 / dVar15);
            fVar6 = 1.0 - (float)(dVar3 / dVar4);
          }
          else {
            dVar3 = log(dVar3 / dVar13);
            dVar4 = log(dVar15 / dVar13);
            fVar6 = (float)(dVar3 / dVar4);
          }
        }
        else {
          fVar6 = -(float)dVar12 / ((float)dVar4 - (float)dVar12);
          if ((v != 0.0) || (NAN(v))) {
            if (0.0 <= v) {
              dVar3 = log(dVar3 / dVar14);
              dVar4 = log(dVar15 / dVar14);
              fVar6 = (float)(dVar3 / dVar4) * (1.0 - (fVar6 + zero_deadzone_halfsize)) +
                      fVar6 + zero_deadzone_halfsize;
            }
            else {
              dVar3 = log(-dVar3 / dVar14);
              dVar4 = log(-dVar13 / dVar14);
              fVar6 = (1.0 - (float)(dVar3 / dVar4)) * (fVar6 - zero_deadzone_halfsize);
            }
          }
        }
      }
      if (v_max < v_min) {
        fVar6 = 1.0 - fVar6;
      }
    }
    else {
      fVar6 = (float)((dVar3 - v_min) / (v_max - v_min));
    }
  }
  return fVar6;
}

Assistant:

float ImGui::ScaleRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return 0.0f;
    IM_UNUSED(data_type);

    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_logarithmic)
    {
        bool flipped = v_max < v_min;

        if (flipped) // Handle the case where the range is backwards
            ImSwap(v_min, v_max);

        // Fudge min/max to avoid getting close to log(0)
        FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
        FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

        // Awkward special cases - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
        if ((v_min == 0.0f) && (v_max < 0.0f))
            v_min_fudged = -logarithmic_zero_epsilon;
        else if ((v_max == 0.0f) && (v_min < 0.0f))
            v_max_fudged = -logarithmic_zero_epsilon;

        float result;

        if (v_clamped <= v_min_fudged)
            result = 0.0f; // Workaround for values that are in-range but below our fudge
        else if (v_clamped >= v_max_fudged)
            result = 1.0f; // Workaround for values that are in-range but above our fudge
        else if ((v_min * v_max) < 0.0f) // Range crosses zero, so split into two portions
        {
            float zero_point_center = (-(float)v_min) / ((float)v_max - (float)v_min); // The zero point in parametric space.  There's an argument we should take the logarithmic nature into account when calculating this, but for now this should do (and the most common case of a symmetrical range works fine)
            float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
            float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
            if (v == 0.0f)
                result = zero_point_center; // Special case for exactly zero
            else if (v < 0.0f)
                result = (1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(-v_min_fudged / logarithmic_zero_epsilon))) * zero_point_snap_L;
            else
                result = zero_point_snap_R + ((float)(ImLog((FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(v_max_fudged / logarithmic_zero_epsilon)) * (1.0f - zero_point_snap_R));
        }
        else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
            result = 1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / -v_max_fudged) / ImLog(-v_min_fudged / -v_max_fudged));
        else
            result = (float)(ImLog((FLOATTYPE)v_clamped / v_min_fudged) / ImLog(v_max_fudged / v_min_fudged));

        return flipped ? (1.0f - result) : result;
    }

    // Linear slider
    return (float)((FLOATTYPE)(SIGNEDTYPE)(v_clamped - v_min) / (FLOATTYPE)(SIGNEDTYPE)(v_max - v_min));
}